

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# calendar.c
# Opt level: O1

service_availability_t parse_service_availability(char *value)

{
  int iVar1;
  service_availability_t sVar2;
  
  iVar1 = strcmp(value,"0");
  if (iVar1 == 0) {
    sVar2 = SA_UNAVAILABLE;
  }
  else {
    iVar1 = strcmp(value,"1");
    sVar2 = SA_NOT_SET - (iVar1 == 0);
  }
  return sVar2;
}

Assistant:

service_availability_t parse_service_availability(const char *value) {
    if (strcmp(value, "0") == 0)
        return SA_UNAVAILABLE;
    else if (strcmp(value, "1") == 0)
        return SA_AVAILABLE;
    else
        return SA_NOT_SET;
}